

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::imageFormatProperties2
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format,VkImageType imageType
          ,VkImageTiling tiling)

{
  ostringstream *this;
  ostringstream *this_00;
  ostringstream *this_01;
  PlatformInterface *vkp;
  VkPhysicalDevice physicalDevice;
  TestStatus *pTVar1;
  VkResult value;
  VkResult value_00;
  int iVar2;
  TestError *this_02;
  undefined4 in_register_00000014;
  ulong uVar3;
  VkImageUsageFlags usage;
  VkImageCreateFlags flags;
  RefBase<vk::VkInstance_s_*> local_6f8;
  TestLog *local_6e0;
  TestStatus *local_6d8;
  VkPhysicalDeviceImageFormatInfo2KHR imageFormatInfo;
  VkImageFormatProperties2KHR extProperties;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  VkImageFormatProperties coreProperties;
  MessageBuilder local_638;
  InstanceDriver vki;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  
  vkp = context->m_platformInterface;
  local_6e0 = context->m_testCtx->m_log;
  local_6d8 = __return_storage_ptr__;
  createInstanceWithExtension
            ((Move<vk::VkInstance_s_*> *)&vki,vkp,(char *)CONCAT44(in_register_00000014,format));
  local_6f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)vki.m_vk.enumeratePhysicalDevices;
  local_6f8.m_data.object = (VkInstance_s *)vki.super_InstanceInterface._vptr_InstanceInterface;
  local_6f8.m_data.deleter.m_destroyInstance = vki.m_vk.destroyInstance;
  vki.super_InstanceInterface._vptr_InstanceInterface = (_func_int **)0x0;
  vki.m_vk.destroyInstance = (DestroyInstanceFunc)0x0;
  vki.m_vk.enumeratePhysicalDevices = (EnumeratePhysicalDevicesFunc)0x0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase((RefBase<vk::VkInstance_s_*> *)&vki);
  ::vk::InstanceDriver::InstanceDriver(&vki,vkp,local_6f8.m_data.object);
  ::vk::enumeratePhysicalDevices(&devices,&vki.super_InstanceInterface,local_6f8.m_data.object);
  uVar3 = 0;
  do {
    if ((ulong)((long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)devices.
                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_638,"Querying image format properties succeeded",
                 (allocator<char> *)&local_330);
      pTVar1 = local_6d8;
      tcu::TestStatus::pass(local_6d8,(string *)&local_638);
      std::__cxx11::string::~string((string *)&local_638);
      std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
      ~_Vector_base(&devices.
                     super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   );
      ::vk::InstanceDriver::~InstanceDriver(&vki);
      ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_6f8);
      return pTVar1;
    }
    physicalDevice =
         devices.
         super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar3];
    for (usage = 1; usage != 0x100; usage = usage + 1) {
      for (flags = 0; flags != 0x20; flags = flags + 1) {
        imageFormatInfo.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_FORMAT_INFO_2_KHR;
        imageFormatInfo.pNext = (void *)0x0;
        coreProperties.maxExtent.width = 0xcdcdcdcd;
        coreProperties.maxExtent.height = 0xcdcdcdcd;
        coreProperties.maxExtent.depth = 0xcdcdcdcd;
        coreProperties.maxMipLevels = 0xcdcdcdcd;
        coreProperties.maxArrayLayers = 0xcdcdcdcd;
        coreProperties.sampleCounts = 0xcdcdcdcd;
        coreProperties.maxResourceSize = 0xcdcdcdcdcdcdcdcd;
        extProperties.imageFormatProperties.maxExtent.width = 0xcdcdcdcd;
        extProperties.imageFormatProperties.maxExtent.height = 0xcdcdcdcd;
        extProperties.imageFormatProperties.maxExtent.depth = 0xcdcdcdcd;
        extProperties.imageFormatProperties.maxMipLevels = 0xcdcdcdcd;
        extProperties.imageFormatProperties.maxArrayLayers = 0xcdcdcdcd;
        extProperties.imageFormatProperties.sampleCounts = 0xcdcdcdcd;
        extProperties.imageFormatProperties.maxResourceSize = 0xcdcdcdcdcdcdcdcd;
        extProperties.sType = VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR;
        extProperties._4_4_ = 0xcdcdcdcd;
        extProperties.pNext = (void *)0x0;
        imageFormatInfo.format = format;
        imageFormatInfo.type = imageType;
        imageFormatInfo.tiling = tiling;
        imageFormatInfo.usage = usage;
        imageFormatInfo.flags = flags;
        value = ::vk::InstanceDriver::getPhysicalDeviceImageFormatProperties
                          (&vki,physicalDevice,format,imageType,tiling,usage,flags,&coreProperties);
        value_00 = ::vk::InstanceDriver::getPhysicalDeviceImageFormatProperties2KHR
                             (&vki,physicalDevice,&imageFormatInfo,&extProperties);
        if (extProperties.sType != VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR) {
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,(char *)0x0,
                     "extProperties.sType == VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                     ,0x994);
LAB_004a4119:
          __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (extProperties.pNext != (void *)0x0) {
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,(char *)0x0,"extProperties.pNext == DE_NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                     ,0x995);
          goto LAB_004a4119;
        }
        if ((value != value_00) ||
           (iVar2 = bcmp(&coreProperties,&extProperties.imageFormatProperties,0x20),
           value_00 = value, iVar2 != 0)) {
          this = &local_1b0.m_str;
          local_1b0.m_log = local_6e0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
          std::operator<<((ostream *)this,"ERROR: device ");
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          std::operator<<((ostream *)this,": mismatch with query ");
          ::vk::operator<<((ostream *)this,&imageFormatInfo);
          local_330.m_log =
               tcu::MessageBuilder::operator<<
                         (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          this_00 = &local_330.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,"vkGetPhysicalDeviceImageFormatProperties() returned ")
          ;
          ::vk::operator<<((ostream *)this_00,value);
          std::operator<<((ostream *)this_00,", ");
          ::vk::operator<<((ostream *)this_00,&coreProperties);
          local_638.m_log =
               tcu::MessageBuilder::operator<<
                         (&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
          this_01 = &local_638.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
          std::operator<<((ostream *)this_01,
                          "vkGetPhysicalDeviceImageFormatProperties2KHR() returned ");
          ::vk::operator<<((ostream *)this_01,value_00);
          std::operator<<((ostream *)this_01,", ");
          ::vk::operator<<((ostream *)this_01,&extProperties);
          tcu::MessageBuilder::operator<<(&local_638,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
          this_02 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_02,
                     "Mismatch between image format properties reported by vkGetPhysicalDeviceImageFormatProperties and vkGetPhysicalDeviceImageFormatProperties2KHR"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                     ,0x99d);
          goto LAB_004a4119;
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus imageFormatProperties2 (Context& context, const VkFormat format, const VkImageType imageType, const VkImageTiling tiling)
{
	TestLog&						log				= context.getTestContext().getLog();

	const PlatformInterface&		vkp				= context.getPlatformInterface();
	const Unique<VkInstance>		instance		(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki				(vkp, *instance);
	const vector<VkPhysicalDevice>	devices			= enumeratePhysicalDevices(vki, *instance);

	const VkImageUsageFlags			allUsageFlags	= VK_IMAGE_USAGE_TRANSFER_SRC_BIT
													| VK_IMAGE_USAGE_TRANSFER_DST_BIT
													| VK_IMAGE_USAGE_SAMPLED_BIT
													| VK_IMAGE_USAGE_STORAGE_BIT
													| VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT
													| VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
	const VkImageCreateFlags		allCreateFlags	= VK_IMAGE_CREATE_SPARSE_BINDING_BIT
													| VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT
													| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT
													| VK_IMAGE_CREATE_MUTABLE_FORMAT_BIT
													| VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		const VkPhysicalDevice	physicalDevice	= devices[deviceNdx];

		for (VkImageUsageFlags curUsageFlags = (VkImageUsageFlags)1; curUsageFlags <= allUsageFlags; curUsageFlags++)
		{
			for (VkImageCreateFlags curCreateFlags = 0; curCreateFlags <= allCreateFlags; curCreateFlags++)
			{
				const VkPhysicalDeviceImageFormatInfo2KHR	imageFormatInfo	=
				{
					VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_FORMAT_INFO_2_KHR,
					DE_NULL,
					format,
					imageType,
					tiling,
					curUsageFlags,
					curCreateFlags
				};

				VkImageFormatProperties						coreProperties;
				VkImageFormatProperties2KHR					extProperties;
				VkResult									coreResult;
				VkResult									extResult;

				deMemset(&coreProperties, 0xcd, sizeof(VkImageFormatProperties));
				deMemset(&extProperties, 0xcd, sizeof(VkImageFormatProperties2KHR));

				extProperties.sType = VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR;
				extProperties.pNext = DE_NULL;

				coreResult	= vki.getPhysicalDeviceImageFormatProperties(physicalDevice, imageFormatInfo.format, imageFormatInfo.type, imageFormatInfo.tiling, imageFormatInfo.usage, imageFormatInfo.flags, &coreProperties);
				extResult	= vki.getPhysicalDeviceImageFormatProperties2KHR(physicalDevice, &imageFormatInfo, &extProperties);

				TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_IMAGE_FORMAT_PROPERTIES_2_KHR);
				TCU_CHECK(extProperties.pNext == DE_NULL);

				if ((coreResult != extResult) ||
					(deMemCmp(&coreProperties, &extProperties.imageFormatProperties, sizeof(VkImageFormatProperties)) != 0))
				{
					log << TestLog::Message << "ERROR: device " << deviceNdx << ": mismatch with query " << imageFormatInfo << TestLog::EndMessage
						<< TestLog::Message << "vkGetPhysicalDeviceImageFormatProperties() returned " << coreResult << ", " << coreProperties << TestLog::EndMessage
						<< TestLog::Message << "vkGetPhysicalDeviceImageFormatProperties2KHR() returned " << extResult << ", " << extProperties << TestLog::EndMessage;
					TCU_FAIL("Mismatch between image format properties reported by vkGetPhysicalDeviceImageFormatProperties and vkGetPhysicalDeviceImageFormatProperties2KHR");
				}
			}
		}
	}

	return tcu::TestStatus::pass("Querying image format properties succeeded");
}